

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testNNCompilerValidationBadProbBlob(void)

{
  ModelDescription *pMVar1;
  FeatureDescription *pFVar2;
  FeatureType *pFVar3;
  ArrayFeatureType *pAVar4;
  DictionaryFeatureType *this;
  ostream *poVar5;
  Result local_128;
  InnerProductLayerParams *innerProductParams2;
  NeuralNetworkLayer *innerProductLayer2;
  InnerProductLayerParams *innerProductParams;
  NeuralNetworkLayer *innerProductLayer;
  StringVector *labels;
  NeuralNetworkClassifier *nn;
  undefined1 local_c8 [8];
  string probsName;
  FeatureDescription *out3;
  FeatureDescription *out2;
  ArrayFeatureType *outshape;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar2 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,"input");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  pAVar4 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar4,1);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  pAVar4 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAVar4,ArrayFeatureType_ArrayDataType_FLOAT32);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar2 = CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,"middle");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  pAVar4 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar4,1);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  pAVar4 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAVar4,ArrayFeatureType_ArrayDataType_FLOAT32);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar2 = CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,"features");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  CoreML::Specification::FeatureType::mutable_stringtype(pFVar3);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar2 = CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,"probs");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  CoreML::Specification::FeatureType::mutable_dictionarytype(pFVar3);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  this = CoreML::Specification::FeatureType::mutable_dictionarytype(pFVar3);
  CoreML::Specification::DictionaryFeatureType::mutable_stringkeytype(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&probsName._M_storage,"features",
             (allocator *)((long)&probsName.super__Rb_tree_node_base._M_right + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&probsName.super__Rb_tree_node_base._M_right + 7));
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  CoreML::Specification::ModelDescription::set_predictedfeaturename
            (pMVar1,(string *)&probsName._M_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_c8,"probs",(allocator *)((long)&nn + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&nn + 7));
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  CoreML::Specification::ModelDescription::set_predictedprobabilitiesname(pMVar1,(string *)local_c8)
  ;
  labels = (StringVector *)
           CoreML::Specification::Model::mutable_neuralnetworkclassifier((Model *)&topIn);
  innerProductLayer =
       (NeuralNetworkLayer *)
       CoreML::Specification::NeuralNetworkClassifier::mutable_stringclasslabels
                 ((NeuralNetworkClassifier *)labels);
  CoreML::Specification::StringVector::add_vector((StringVector *)innerProductLayer,"label1");
  CoreML::Specification::NeuralNetworkClassifier::set_labelprobabilitylayername
            ((NeuralNetworkClassifier *)labels,"not_here");
  innerProductParams =
       (InnerProductLayerParams *)
       CoreML::Specification::NeuralNetworkClassifier::add_layers((NeuralNetworkClassifier *)labels)
  ;
  CoreML::Specification::NeuralNetworkLayer::add_input
            ((NeuralNetworkLayer *)innerProductParams,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output
            ((NeuralNetworkLayer *)innerProductParams,"middle");
  innerProductLayer2 =
       (NeuralNetworkLayer *)
       CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct
                 ((NeuralNetworkLayer *)innerProductParams);
  CoreML::Specification::InnerProductLayerParams::set_hasbias
            ((InnerProductLayerParams *)innerProductLayer2,false);
  innerProductParams2 =
       (InnerProductLayerParams *)
       CoreML::Specification::NeuralNetworkClassifier::add_layers((NeuralNetworkClassifier *)labels)
  ;
  CoreML::Specification::NeuralNetworkLayer::add_input
            ((NeuralNetworkLayer *)innerProductParams2,"middle");
  CoreML::Specification::NeuralNetworkLayer::add_output
            ((NeuralNetworkLayer *)innerProductParams2,"output");
  local_128.m_message._M_storage._M_storage =
       (uchar  [8])
       CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct
                 ((NeuralNetworkLayer *)innerProductParams2);
  CoreML::Specification::InnerProductLayerParams::set_hasbias
            ((InnerProductLayerParams *)local_128.m_message._M_storage._M_storage,false);
  CoreML::validate<(MLModelType)403>(&local_128,(Model *)&topIn);
  m1._oneof_case_[0]._0_1_ = CoreML::Result::good(&local_128);
  if (m1._oneof_case_[0]._0_1_) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x456);
    poVar5 = std::operator<<(poVar5,": error: ");
    poVar5 = std::operator<<(poVar5,"!((res).good())");
    poVar5 = std::operator<<(poVar5," was false, expected true.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result(&local_128);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)&probsName._M_storage);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testNNCompilerValidationBadProbBlob() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    topIn->mutable_type()->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_FLOAT32);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("middle");
    auto *outshape = out->mutable_type()->mutable_multiarraytype();
    outshape->add_shape(1);
    out->mutable_type()->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_FLOAT32);

    auto *out2 = m1.mutable_description()->add_output();
    out2->set_name("features");
    out2->mutable_type()->mutable_stringtype();

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_dictionarytype();
    out3->mutable_type()->mutable_dictionarytype()->mutable_stringkeytype();

    std::string featureName = "features";
    m1.mutable_description()->set_predictedfeaturename(featureName);
    std::string probsName = "probs";
    m1.mutable_description()->set_predictedprobabilitiesname(probsName);


    const auto nn = m1.mutable_neuralnetworkclassifier();
    auto labels = nn->mutable_stringclasslabels();
    labels->add_vector("label1");
    nn->set_labelprobabilitylayername("not_here");

    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();
    innerProductLayer->add_input("input");
    innerProductLayer->add_output("middle");
    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_hasbias(false);

    Specification::NeuralNetworkLayer *innerProductLayer2 = nn->add_layers();
    innerProductLayer2->add_input("middle");
    innerProductLayer2->add_output("output");
    Specification::InnerProductLayerParams *innerProductParams2 = innerProductLayer2->mutable_innerproduct();
    innerProductParams2->set_hasbias(false);

    Result res = validate<MLModelType_neuralNetworkClassifier>(m1);
    ML_ASSERT_BAD(res);
    return 0;

}